

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

void __thiscall helics::CoreApp::CoreApp(CoreApp *this,shared_ptr<helics::Core> *cr)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  __shared_ptr *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  shared_ptr<helics::Core> *in_stack_ffffffffffffffc8;
  shared_ptr<helics::Core> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  CLI::std::shared_ptr<helics::Core>::shared_ptr
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x10);
  std::__cxx11::string::string(in_stack_ffffffffffffffe0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDI);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<helics::Core,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x44ac5a);
    iVar2 = (*peVar3->_vptr_Core[0xc])();
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar2));
  }
  return;
}

Assistant:

CoreApp::CoreApp(std::shared_ptr<Core> cr): core(std::move(cr))
{
    if (core) {
        name = core->getIdentifier();
    }
}